

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

vector sptk::swipe::spline(vector x,vector y)

{
  bool bVar1;
  double dVar2;
  double *pdVar3;
  double *__ptr;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  double *pdVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  vector vVar19;
  
  pdVar4 = y.v;
  pdVar8 = x.v;
  iVar9 = x.x;
  lVar10 = (long)iVar9;
  pdVar3 = (double *)malloc(lVar10 * 8);
  uVar7 = iVar9 - 1;
  __ptr = (double *)malloc((ulong)uVar7 * 8);
  *pdVar3 = -0.5;
  *__ptr = ((pdVar4[1] - *pdVar4) / (pdVar8[1] - *pdVar8) + -2.0) * (3.0 / (pdVar8[1] - *pdVar8));
  if (2 < iVar9) {
    dVar18 = *pdVar3;
    dVar11 = *__ptr;
    uVar6 = 1;
    do {
      dVar15 = pdVar8[uVar6];
      dVar2 = (pdVar8 + uVar6)[1];
      dVar12 = dVar2 - pdVar8[uVar6 - 1];
      auVar16._0_8_ = dVar15 - pdVar8[uVar6 - 1];
      auVar16._8_8_ = dVar2 - dVar15;
      dVar15 = pdVar4[uVar6];
      auVar13._0_8_ = dVar15 - pdVar4[uVar6 - 1];
      auVar13._8_8_ = (pdVar4 + uVar6)[1] - dVar15;
      auVar14 = divpd(auVar13,auVar16);
      dVar15 = auVar16._0_8_ / dVar12;
      dVar18 = dVar15 * dVar18 + 2.0;
      auVar17._0_8_ = dVar15 + -1.0;
      auVar17._8_8_ = ((auVar14._8_8_ - auVar14._0_8_) * 6.0) / dVar12 - dVar11 * dVar15;
      auVar14._8_8_ = dVar18;
      auVar14._0_8_ = dVar18;
      auVar14 = divpd(auVar17,auVar14);
      dVar18 = auVar14._0_8_;
      pdVar3[uVar6] = dVar18;
      dVar11 = auVar14._8_8_;
      __ptr[uVar6] = dVar11;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  pdVar3[lVar10 + -1] =
       (__ptr[lVar10 + -2] * -0.5 +
       (2.0 - (pdVar4[(long)y.x + -1] - pdVar4[(long)y.x + -2]) /
              (pdVar8[(int)uVar7] - pdVar8[lVar10 + -2])) *
       (3.0 / (pdVar8[(int)uVar7] - pdVar8[lVar10 + -2]))) / (pdVar3[lVar10 + -2] * 0.5 + 1.0);
  if (1 < iVar9) {
    dVar18 = pdVar3[(ulong)(iVar9 - 2) + 1];
    lVar10 = (ulong)(iVar9 - 2) + 1;
    do {
      dVar18 = dVar18 * pdVar3[lVar10 + -1] + __ptr[lVar10 + -1];
      pdVar3[lVar10 + -1] = dVar18;
      lVar5 = lVar10 + -1;
      bVar1 = 0 < lVar10;
      lVar10 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  free(__ptr);
  vVar19._0_8_ = x._0_8_ & 0xffffffff;
  vVar19.v = pdVar3;
  return vVar19;
}

Assistant:

vector spline(vector x, vector y) {
    int i, j;
    double p, qn, sig;
    vector y2 = makev(x.x);
#if 0
    double* u = malloc((unsigned) (x.x - 1) * sizeof(double));
#else
    double* u = (double*) malloc((unsigned) (x.x - 1) * sizeof(double));
#endif
    y2.v[0] = -.5; // left boundary
    u[0] = (3. / (x.v[1] - x.v[0])) * ((y.v[1] - y.v[0]) /
                                       (x.v[1] - x.v[0]) - YP1);
    for (i = 1; i < x.x - 1; i++) { // decomp loop
        sig = (x.v[i] - x.v[i - 1]) / (x.v[i + 1] - x.v[i - 1]);
        p = sig * y2.v[i - 1] + 2.;
        y2.v[i] = (sig - 1.) / p;
        u[i] = (y.v[i + 1] - y.v[i]) / (x.v[i + 1] - x.v[i]) -
               (y.v[i] - y.v[i - 1]) / (x.v[i] - x.v[i - 1]);
        u[i] = (6 * u[i] / (x.v[i + 1] - x.v[i - 1]) - sig * u[i - 1]) / p;
    }
    qn = .5; // right boundary
    y2.v[y2.x - 1] = ((3. / (x.v[x.x - 1] - x.v[x.x - 2])) * (YPN -
                      (y.v[y.x - 1] - y.v[y.x -  2]) / (x.v[x.x - 1] -
                       x.v[x.x - 2])) - qn * u[x.x - 2]) /
                       (qn * y2.v[y2.x - 2] + 1.);
    for (j = x.x - 2; j >= 0; j--) // backsubstitution loop
        y2.v[j] = y2.v[j] * y2.v[j + 1] + u[j];
    free(u);
    return(y2);
}